

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glu.cpp
# Opt level: O1

int __thiscall ncnn::GLU::forward(GLU *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  void *pvVar12;
  void *pvVar13;
  ulong uVar14;
  void *pvVar15;
  float fVar16;
  void *local_68;
  void *local_60;
  void *local_58;
  
  uVar5 = bottom_blob->dims;
  if (uVar5 == 1) {
    iVar3 = bottom_blob->w;
    uVar5 = iVar3 / 2;
    Mat::create(top_blob,uVar5,4,opt->blob_allocator);
    if (1 < iVar3) {
      pvVar15 = bottom_blob->data;
      pvVar13 = top_blob->data;
      uVar9 = 0;
      do {
        fVar16 = expf(-*(float *)((long)pvVar15 + uVar9 * 4 + (ulong)uVar5 * 4));
        *(float *)((long)pvVar13 + uVar9 * 4) =
             *(float *)((long)pvVar15 + uVar9 * 4) / (fVar16 + 1.0);
        uVar9 = uVar9 + 1;
      } while (uVar5 != uVar9);
      return 0;
    }
  }
  else {
    iVar3 = (this->axis >> 0x1f & uVar5) + this->axis;
    if ((uVar5 == 2) && (iVar3 == 0)) {
      iVar3 = bottom_blob->w;
      iVar6 = bottom_blob->h / 2;
      Mat::create(top_blob,iVar3,iVar6,4,opt->blob_allocator);
      uVar5 = iVar6 * iVar3;
      if (0 < (int)uVar5) {
        pvVar15 = bottom_blob->data;
        pvVar13 = top_blob->data;
        uVar9 = 0;
        do {
          fVar16 = expf(-*(float *)((long)pvVar15 + uVar9 * 4 + (ulong)uVar5 * 4));
          *(float *)((long)pvVar13 + uVar9 * 4) =
               *(float *)((long)pvVar15 + uVar9 * 4) / (fVar16 + 1.0);
          uVar9 = uVar9 + 1;
        } while (uVar5 != uVar9);
        return 0;
      }
    }
    else if ((uVar5 == 2) && (iVar3 == 1)) {
      iVar3 = bottom_blob->w;
      iVar6 = bottom_blob->h;
      uVar5 = iVar3 / 2;
      Mat::create(top_blob,uVar5,iVar6,4,opt->blob_allocator);
      if (0 < (long)iVar6) {
        pvVar13 = bottom_blob->data;
        pvVar12 = top_blob->data;
        iVar8 = top_blob->w;
        lVar4 = (long)bottom_blob->w * bottom_blob->elemsize;
        sVar1 = top_blob->elemsize;
        pvVar15 = (void *)((long)pvVar13 + (ulong)uVar5 * 4);
        lVar10 = 0;
        do {
          if (1 < iVar3) {
            uVar9 = 0;
            do {
              fVar16 = expf(-*(float *)((long)pvVar15 + uVar9 * 4));
              *(float *)((long)pvVar12 + uVar9 * 4) =
                   *(float *)((long)pvVar13 + uVar9 * 4) / (fVar16 + 1.0);
              uVar9 = uVar9 + 1;
            } while (uVar5 != uVar9);
          }
          lVar10 = lVar10 + 1;
          pvVar15 = (void *)((long)pvVar15 + lVar4);
          pvVar12 = (void *)((long)pvVar12 + (long)iVar8 * sVar1);
          pvVar13 = (void *)((long)pvVar13 + lVar4);
        } while (lVar10 != iVar6);
      }
    }
    else if ((uVar5 == 3) && (iVar3 == 0)) {
      iVar3 = bottom_blob->w;
      iVar6 = bottom_blob->h;
      iVar8 = bottom_blob->c;
      uVar5 = iVar8 / 2;
      Mat::create(top_blob,iVar3,iVar6,uVar5,4,opt->blob_allocator);
      if (1 < iVar8) {
        uVar7 = iVar6 * iVar3;
        pvVar13 = bottom_blob->data;
        pvVar12 = top_blob->data;
        sVar1 = top_blob->cstep;
        lVar4 = bottom_blob->cstep * bottom_blob->elemsize;
        sVar2 = top_blob->elemsize;
        pvVar15 = (void *)((long)pvVar13 + (long)(int)((int)bottom_blob->cstep * uVar5) * 4);
        uVar9 = 0;
        do {
          if (0 < (int)uVar7) {
            uVar14 = 0;
            do {
              fVar16 = expf(-*(float *)((long)pvVar15 + uVar14 * 4));
              *(float *)((long)pvVar12 + uVar14 * 4) =
                   *(float *)((long)pvVar13 + uVar14 * 4) / (fVar16 + 1.0);
              uVar14 = uVar14 + 1;
            } while (uVar7 != uVar14);
          }
          uVar9 = uVar9 + 1;
          pvVar15 = (void *)((long)pvVar15 + lVar4);
          pvVar12 = (void *)((long)pvVar12 + sVar1 * sVar2);
          pvVar13 = (void *)((long)pvVar13 + lVar4);
        } while (uVar9 != uVar5);
      }
    }
    else if ((uVar5 == 3) && (iVar3 == 1)) {
      iVar3 = bottom_blob->w;
      iVar6 = bottom_blob->c;
      iVar8 = bottom_blob->h / 2;
      Mat::create(top_blob,iVar3,iVar8,iVar6,4,opt->blob_allocator);
      if (0 < (long)iVar6) {
        uVar5 = iVar8 * iVar3;
        pvVar13 = bottom_blob->data;
        pvVar12 = top_blob->data;
        sVar1 = top_blob->cstep;
        lVar4 = bottom_blob->cstep * bottom_blob->elemsize;
        sVar2 = top_blob->elemsize;
        pvVar15 = (void *)((long)pvVar13 + (ulong)uVar5 * 4);
        lVar10 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar9 = 0;
            do {
              fVar16 = expf(-*(float *)((long)pvVar15 + uVar9 * 4));
              *(float *)((long)pvVar12 + uVar9 * 4) =
                   *(float *)((long)pvVar13 + uVar9 * 4) / (fVar16 + 1.0);
              uVar9 = uVar9 + 1;
            } while (uVar5 != uVar9);
          }
          lVar10 = lVar10 + 1;
          pvVar15 = (void *)((long)pvVar15 + lVar4);
          pvVar12 = (void *)((long)pvVar12 + sVar1 * sVar2);
          pvVar13 = (void *)((long)pvVar13 + lVar4);
        } while (lVar10 != iVar6);
        return 0;
      }
    }
    else {
      if (uVar5 != 3) {
        return -100;
      }
      if (iVar3 != 2) {
        return -100;
      }
      iVar3 = bottom_blob->w;
      iVar6 = bottom_blob->h;
      iVar8 = bottom_blob->c;
      uVar5 = iVar3 / 2;
      Mat::create(top_blob,uVar5,iVar6,iVar8,4,opt->blob_allocator);
      if (0 < (long)iVar8) {
        local_58 = bottom_blob->data;
        local_60 = top_blob->data;
        sVar1 = top_blob->cstep;
        lVar4 = bottom_blob->cstep * bottom_blob->elemsize;
        local_68 = (void *)((long)local_58 + (ulong)uVar5 * 4);
        sVar2 = top_blob->elemsize;
        lVar10 = 0;
        do {
          if (0 < iVar6) {
            iVar11 = 0;
            pvVar15 = local_60;
            pvVar13 = local_58;
            pvVar12 = local_68;
            do {
              if (1 < iVar3) {
                uVar9 = 0;
                do {
                  fVar16 = expf(-*(float *)((long)pvVar12 + uVar9 * 4));
                  *(float *)((long)pvVar15 + uVar9 * 4) =
                       *(float *)((long)pvVar13 + uVar9 * 4) / (fVar16 + 1.0);
                  uVar9 = uVar9 + 1;
                } while (uVar5 != uVar9);
              }
              iVar11 = iVar11 + 1;
              pvVar12 = (void *)((long)pvVar12 + (long)iVar3 * 4);
              pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar5 * 4);
              pvVar13 = (void *)((long)pvVar13 + (long)iVar3 * 4);
            } while (iVar11 != iVar6);
          }
          lVar10 = lVar10 + 1;
          local_68 = (void *)((long)local_68 + lVar4);
          local_60 = (void *)((long)local_60 + sVar1 * sVar2);
          local_58 = (void *)((long)local_58 + lVar4);
        } while (lVar10 != iVar8);
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

int GLU::forward(const Mat& bottom_blob, Mat& top_blob,
                 const Option& opt) const
{
    int dims = bottom_blob.dims;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1)
    {   // ignore axis
        int w = bottom_blob.w;
        int out_w = w / 2;
        top_blob.create(out_w, sizeof(float), opt.blob_allocator);

        const float* in_ptr = bottom_blob;
        float* out_ptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int x = 0; x < out_w; ++x)
        {
            float sigmoid = 1.f / (1.f + expf(-in_ptr[x + out_w]));

            out_ptr[x] = in_ptr[x] * sigmoid;
        }

        return 0;
    } // if (dims == 1)

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int out_w = w;
        int out_h = h / 2;
        top_blob.create(out_w, out_h, sizeof(float), opt.blob_allocator);

        int offset = out_w * out_h;

#if 0
        // this one is equivalent to the else branch. It is more readable
        // but less efficient
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < out_h; ++y) {
            const float *in_ptr = bottom_blob.row(y);
            float *out_ptr = top_blob.row(y);

            for (int x = 0; x < w; ++x) {
                float sigmoid =
                    1.f / (1.f + expf(-in_ptr[x + offset]));

                out_ptr[x] = in_ptr[x] * sigmoid;
            }
        }
#else
        int size = offset;
        const float* in_ptr = bottom_blob;
        float* out_ptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; ++i)
        {
            float sigmoid = 1.f / (1.f + expf(-in_ptr[i + offset]));
            out_ptr[i] = in_ptr[i] * sigmoid;
        }
#endif

        return 0;
    } // if (dims == 2 && positive_axis == 0)

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int out_w = w / 2;
        int out_h = h;

        top_blob.create(out_w, out_h, sizeof(float), opt.blob_allocator);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; ++y)
        {
            const float* in_ptr = bottom_blob.row(y);
            float* out_ptr = top_blob.row(y);

            for (int x = 0; x < out_w; ++x)
            {
                float sigmoid = 1.f / (1.f + expf(-in_ptr[x + out_w]));
                out_ptr[x] = in_ptr[x] * sigmoid;
            }
        }

        return 0;
    } // if (dims == 2 && positive_axis == 1)

    if (dims == 3 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int c = bottom_blob.c;

        int out_w = w;
        int out_h = h;
        int out_c = c / 2;

        top_blob.create(out_w, out_h, out_c, sizeof(float), opt.blob_allocator);

        int offset = out_c * bottom_blob.cstep;
        int size = w * h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < out_c; ++q)
        {
            const float* in_ptr = bottom_blob.channel(q);
            float* out_ptr = top_blob.channel(q);

            for (int i = 0; i < size; ++i)
            {
                float sigmoid = 1.f / (1.f + expf(-in_ptr[i + offset]));
                out_ptr[i] = in_ptr[i] * sigmoid;
            }
        }
        return 0;
    } //   if (dims == 3 && positive_axis == 0) {

    if (dims == 3 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int c = bottom_blob.c;

        int out_w = w;
        int out_h = h / 2;
        int out_c = c;

        top_blob.create(out_w, out_h, out_c, sizeof(float), opt.blob_allocator);

        int offset = out_h * out_w;
        int size = offset;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const float* in_ptr = bottom_blob.channel(q);
            float* out_ptr = top_blob.channel(q);

            for (int i = 0; i < size; ++i)
            {
                float sigmoid = 1.f / (1.f + expf(-in_ptr[i + offset]));
                out_ptr[i] = in_ptr[i] * sigmoid;
            }
        }
        return 0;
    } // if (dims == 3 && positive_axis == 1)

    if (dims == 3 && positive_axis == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int c = bottom_blob.c;

        int out_w = w / 2;
        int out_h = h;
        int out_c = c;

        top_blob.create(out_w, out_h, out_c, sizeof(float), opt.blob_allocator);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const float* in_ptr = bottom_blob.channel(q);
            float* out_ptr = top_blob.channel(q);
            for (int y = 0; y < h; ++y)
            {
                for (int x = 0; x < out_w; ++x)
                {
                    float sigmoid = 1.f / (1.f + expf(-in_ptr[x + out_w]));
                    out_ptr[x] = in_ptr[x] * sigmoid;
                }
                in_ptr += w;
                out_ptr += out_w;
            }
        }
        return 0;
    } // if (dims == 3 && positive_axis == 2)

    return -100;
}